

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Station.cpp
# Opt level: O0

void __thiscall imrt::Station::setUniformIntensity(Station *this,double intensity)

{
  int iVar1;
  pair<int,_int> pVar2;
  reference pvVar3;
  reference pvVar4;
  long in_RDI;
  int j;
  pair<int,_int> aux;
  int i;
  int a;
  int in_stack_00000048;
  int in_stack_0000004c;
  Station *in_stack_00000050;
  Collimator *in_stack_ffffffffffffffb8;
  int local_24;
  int local_20;
  int iStack_1c;
  int local_18;
  int local_14;
  
  for (local_14 = 0; local_14 < *(int *)(in_RDI + 0x40); local_14 = local_14 + 1) {
    for (local_18 = 0; iVar1 = Collimator::getXdim(*(Collimator **)(in_RDI + 0xb0)),
        local_18 < iVar1; local_18 = local_18 + 1) {
      pVar2 = Collimator::getActiveRange(in_stack_ffffffffffffffb8,0,0x14c07a);
      local_20 = pVar2.first;
      if (-1 < local_20) {
        for (local_24 = local_20; iStack_1c = pVar2.second, local_24 <= iStack_1c;
            local_24 = local_24 + 1) {
          pvVar3 = std::
                   vector<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
                   ::operator[]((vector<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
                                 *)(in_RDI + 0x58),(long)local_14);
          pvVar4 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::
                   operator[](pvVar3,(long)local_18);
          if (pvVar4->first <= local_24) {
            pvVar3 = std::
                     vector<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
                     ::operator[]((vector<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
                                   *)(in_RDI + 0x58),(long)local_14);
            pvVar4 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::
                     operator[](pvVar3,(long)local_18);
            if (local_24 <= pvVar4->second) {
              change_intensity(in_stack_00000050,in_stack_0000004c,in_stack_00000048,(double)this,
                               (list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                                *)intensity);
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

void Station::setUniformIntensity(double intensity){
    for (int a=0 ; a<max_apertures; a++) {
      for (int i=0; i < collimator.getXdim(); i++) {
        pair <int,int> aux = collimator.getActiveRange(i,angle);
        if (aux.first<0) continue;
        for (int j=aux.first; j<=aux.second; j++) {
          if (j>=A[a][i].first && j<=A[a][i].second){
            change_intensity(i, j, intensity);
          }
        }
      }
    }
  }